

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

float64 log_full_eval(vector_t obs,float32 norm,vector_t mean,vector_t *var_inv,uint32 veclen)

{
  vector_t pfVar1;
  void *ptr;
  ulong uVar2;
  void *ptr_00;
  ulong uVar3;
  ulong n_elem;
  double local_38;
  
  local_38 = (double)(float)norm;
  n_elem = (ulong)veclen;
  ptr = __ckd_malloc__(n_elem * 8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                       ,0x370);
  if (veclen == 0) {
    ptr_00 = __ckd_calloc__(n_elem,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x378);
  }
  else {
    uVar2 = 0;
    do {
      *(double *)((long)ptr + uVar2 * 8) = (double)(obs[uVar2] - mean[uVar2]);
      uVar2 = uVar2 + 1;
    } while (n_elem != uVar2);
    ptr_00 = __ckd_calloc__(n_elem,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x378);
    if (veclen != 0) {
      uVar2 = 0;
      do {
        pfVar1 = var_inv[uVar2];
        uVar3 = 0;
        do {
          *(double *)((long)ptr_00 + uVar3 * 8) =
               (double)pfVar1[uVar3] * *(double *)((long)ptr + uVar2 * 8) +
               *(double *)((long)ptr_00 + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (n_elem != uVar3);
        uVar2 = uVar2 + 1;
      } while (uVar2 != n_elem);
      if (veclen != 0) {
        uVar2 = 0;
        do {
          local_38 = local_38 +
                     *(double *)((long)ptr + uVar2 * 8) * -0.5 *
                     *(double *)((long)ptr_00 + uVar2 * 8);
          uVar2 = uVar2 + 1;
        } while (n_elem != uVar2);
      }
    }
  }
  ckd_free(ptr_00);
  ckd_free(ptr);
  return (float64)local_38;
}

Assistant:

float64
log_full_eval(vector_t obs,
	      float32 norm,
	      vector_t mean,
	      vector_t *var_inv,
	      uint32 veclen)
{
    float64 *diff, *vtmp, d;
    uint32 i, j;
    
    d = norm;

    /* Precompute x-m */
    diff = ckd_malloc(veclen * sizeof(float64));
    for (i = 0; i < veclen; i++)
	diff[i] = obs[i] - mean[i];

    /* Compute -0.5 * (x-m) * sigma^-1 * (x-m)^T */
    /* FIXME: We could probably use BLAS for this, though it is
     * unclear if that would actually be faster (particularly with
     * refblas) */
    vtmp = ckd_calloc(veclen, sizeof(float64));
    for (i = 0; i < veclen; ++i)
	for (j = 0; j < veclen; ++j)
	    vtmp[j] += var_inv[i][j] * diff[i];
    for (i = 0; i < veclen; ++i)
	d -= 0.5 * diff[i] * vtmp[i];
    ckd_free(vtmp);
    ckd_free(diff);

    return d;
}